

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

_Bool Curl_bufq_peek_at(bufq *q,size_t offset,uchar **pbuf,size_t *plen)

{
  uchar **ppuVar1;
  size_t clen;
  buf_chunk *c;
  size_t *plen_local;
  uchar **pbuf_local;
  size_t offset_local;
  bufq *q_local;
  
  clen = (size_t)q->head;
  pbuf_local = (uchar **)offset;
  while ((clen != 0 && (ppuVar1 = (uchar **)chunk_len((buf_chunk *)clen), ppuVar1 != (uchar **)0x0))
        ) {
    if (pbuf_local < ppuVar1) {
      chunk_peek_at((buf_chunk *)clen,(size_t)pbuf_local,pbuf,plen);
      return true;
    }
    pbuf_local = (uchar **)((long)pbuf_local - (long)ppuVar1);
    clen = *(size_t *)clen;
  }
  *pbuf = (uchar *)0x0;
  *plen = 0;
  return false;
}

Assistant:

bool Curl_bufq_peek_at(struct bufq *q, size_t offset,
                       const unsigned char **pbuf, size_t *plen)
{
  struct buf_chunk *c = q->head;
  size_t clen;

  while(c) {
    clen = chunk_len(c);
    if(!clen)
      break;
    if(offset >= clen) {
      offset -= clen;
      c = c->next;
      continue;
    }
    chunk_peek_at(c, offset, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}